

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseImmediate(MipsParser *this,Parser *parser,Expression *dest)

{
  Tokenizer *pTVar1;
  TokenizerPosition pos_00;
  Token *pTVar2;
  Expression local_a8;
  undefined4 local_8c;
  iterator local_88;
  byte local_69;
  undefined1 local_68 [7];
  bool isRegister;
  MipsRegisterValue tempValue;
  bool hasParen;
  TokenizerPosition pos;
  Expression *dest_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  pTVar1 = Parser::getTokenizer(parser);
  pos_00 = Tokenizer::getPosition(pTVar1);
  pTVar2 = Parser::peekToken(parser,0);
  tempValue._47_1_ = pTVar2->type == LParen;
  if ((bool)tempValue._47_1_) {
    Parser::eatToken(parser);
  }
  MipsRegisterValue::MipsRegisterValue((MipsRegisterValue *)local_68);
  local_69 = parseRegister(this,parser,(MipsRegisterValue *)local_68);
  pTVar1 = Parser::getTokenizer(parser);
  local_88 = pos_00.it._M_node;
  Tokenizer::setPosition(pTVar1,pos_00);
  if ((local_69 & 1) == 0) {
    Parser::parseExpression(&local_a8,parser);
    Expression::operator=(dest,&local_a8);
    Expression::~Expression(&local_a8);
    this_local._7_1_ = Expression::isLoaded(dest);
  }
  else {
    this_local._7_1_ = false;
  }
  local_8c = 1;
  MipsRegisterValue::~MipsRegisterValue((MipsRegisterValue *)local_68);
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseImmediate(Parser& parser, Expression& dest)
{
	// check for (reg) or reg sequence
	TokenizerPosition pos = parser.getTokenizer()->getPosition();

	bool hasParen = parser.peekToken().type == TokenType::LParen;
	if (hasParen)
		parser.eatToken();

	MipsRegisterValue tempValue;
	bool isRegister = parseRegister(parser,tempValue);
	parser.getTokenizer()->setPosition(pos);

	if (isRegister)
		return false;

	dest = parser.parseExpression();
	return dest.isLoaded();
}